

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O2

BaseStatistics *
duckdb::BaseStatistics::Deserialize
          (BaseStatistics *__return_storage_ptr__,Deserializer *deserializer)

{
  bool bVar1;
  bool bVar2;
  StatisticsType SVar3;
  unsigned_long uVar4;
  LogicalType *type;
  LogicalType local_48;
  
  bVar1 = Deserializer::ReadProperty<bool>(deserializer,100,"has_null");
  bVar2 = Deserializer::ReadProperty<bool>(deserializer,0x65,"has_no_null");
  uVar4 = Deserializer::ReadProperty<unsigned_long>(deserializer,0x66,"distinct_count");
  type = SerializationData::Get<duckdb::LogicalType_const&>(&deserializer->data);
  SVar3 = GetStatsType(type);
  LogicalType::LogicalType(&local_48,type);
  BaseStatistics(__return_storage_ptr__,&local_48);
  LogicalType::~LogicalType(&local_48);
  __return_storage_ptr__->has_null = bVar1;
  __return_storage_ptr__->has_no_null = bVar2;
  __return_storage_ptr__->distinct_count = uVar4;
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x67,"type_stats");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  switch(SVar3) {
  case NUMERIC_STATS:
    NumericStats::Deserialize(deserializer,__return_storage_ptr__);
    break;
  case STRING_STATS:
    StringStats::Deserialize(deserializer,__return_storage_ptr__);
    break;
  case LIST_STATS:
    ListStats::Deserialize(deserializer,__return_storage_ptr__);
    break;
  case STRUCT_STATS:
    StructStats::Deserialize(deserializer,__return_storage_ptr__);
    break;
  case ARRAY_STATS:
    ArrayStats::Deserialize(deserializer,__return_storage_ptr__);
  }
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  return __return_storage_ptr__;
}

Assistant:

BaseStatistics BaseStatistics::Deserialize(Deserializer &deserializer) {
	auto has_null = deserializer.ReadProperty<bool>(100, "has_null");
	auto has_no_null = deserializer.ReadProperty<bool>(101, "has_no_null");
	auto distinct_count = deserializer.ReadProperty<idx_t>(102, "distinct_count");

	// Get the logical type from the deserializer context.
	auto &type = deserializer.Get<const LogicalType &>();
	auto stats_type = GetStatsType(type);

	BaseStatistics stats(type);

	stats.has_null = has_null;
	stats.has_no_null = has_no_null;
	stats.distinct_count = distinct_count;

	deserializer.ReadObject(103, "type_stats", [&](Deserializer &obj) {
		switch (stats_type) {
		case StatisticsType::NUMERIC_STATS:
			NumericStats::Deserialize(obj, stats);
			break;
		case StatisticsType::STRING_STATS:
			StringStats::Deserialize(obj, stats);
			break;
		case StatisticsType::LIST_STATS:
			ListStats::Deserialize(obj, stats);
			break;
		case StatisticsType::STRUCT_STATS:
			StructStats::Deserialize(obj, stats);
			break;
		case StatisticsType::ARRAY_STATS:
			ArrayStats::Deserialize(obj, stats);
			break;
		default:
			break;
		}
	});

	return stats;
}